

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O3

GMM_STATUS
GmmTexGetMipMapOffset
          (GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo,GMM_LIB_CONTEXT *pGmmLibContext)

{
  int iVar1;
  uint uVar2;
  GMM_STATUS GVar3;
  GMM_TEXTURE_CALC *this;
  GMM_STATUS GVar4;
  uint uVar5;
  bool bVar6;
  
  GVar4 = GMM_ERROR;
  if (pReqInfo != (GMM_REQ_OFFSET_INFO *)0x0 && pTexInfo != (GMM_TEXTURE_INFO *)0x0) {
    this = GmmGetTextureCalc(pGmmLibContext);
    if (((pReqInfo->Plane < GMM_MAX_PLANE) && (pReqInfo->MipLevel < 0xf)) &&
       (pTexInfo->TileMode < GMM_TILE_MODES)) {
      uVar5 = *(uint *)pReqInfo;
      if ((uVar5 & 2) == 0) {
        bVar6 = false;
      }
      else {
        if ((uVar5 & 1) != 0) {
          *(uint *)pReqInfo = uVar5 & 0xfffffffe;
        }
        iVar1 = (*this->_vptr_GmmTextureCalc[0xf])(this,pTexInfo,pReqInfo);
        bVar6 = iVar1 != 0;
        uVar2 = uVar5 & 1;
        uVar5 = *(uint *)pReqInfo;
        if (uVar2 != 0) {
          uVar5 = uVar5 | 1;
          *(uint *)pReqInfo = uVar5;
        }
      }
      uVar2 = uVar5;
      if ((uVar5 & 2) != 0) {
        uVar2 = uVar5 & 0xfffffffd;
        *(uint *)pReqInfo = uVar2;
      }
      GVar4 = (GMM_STATUS)bVar6;
      if ((uVar2 & 1) != 0) {
        GVar3 = GmmLib::GmmTextureCalc::GetTexRenderOffset(this,pTexInfo,pReqInfo);
        if (GVar3 != GMM_SUCCESS) {
          GVar4 = GMM_ERROR;
        }
        uVar2 = *(uint *)pReqInfo;
      }
      if ((uVar5 & 2) != 0) {
        uVar2 = uVar2 | 2;
        *(uint *)pReqInfo = uVar2;
      }
      if ((uVar2 & 4) != 0) {
        GmmLib::GmmTextureCalc::GetTexStdLayoutOffset(this,pTexInfo,pReqInfo);
      }
    }
  }
  return GVar4;
}

Assistant:

GMM_STATUS GmmTexGetMipMapOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                 GMM_REQ_OFFSET_INFO *pReqInfo,
                                 GMM_LIB_CONTEXT *    pGmmLibContext)
{
    GMM_STATUS        Status           = GMM_SUCCESS;
    bool              RestoreRenderReq = false;
    bool              RestoreLockReq   = false;
    GMM_TEXTURE_CALC *pTextureCalc;

    GMM_DPF_ENTER;
    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);
    __GMM_ASSERT(pReqInfo->CubeFace <= __GMM_NO_CUBE_MAP);

    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(pTexInfo, pGmmLibContext);

    if((pReqInfo->Plane >= GMM_MAX_PLANE) ||
       (pReqInfo->Plane < GMM_NO_PLANE) ||
       (pReqInfo->MipLevel >= GMM_MAX_MIPMAP))
    {
        GMM_ASSERTDPF(0, "Invalid parameter!");
        return GMM_ERROR;
    }

    if((pTexInfo->TileMode >= GMM_TILE_MODES) ||
       (pTexInfo->TileMode < TILE_NONE))
    {
        GMM_ASSERTDPF(0, "Invalid parameter!");
        return GMM_ERROR;
    }

    // Retrieve offset info at pReqInfo->MipLevel
    if(pReqInfo->ReqLock)
    {
        if(pReqInfo->ReqRender)
        {
            pReqInfo->ReqRender = 0;
            RestoreRenderReq    = true;
        }

        if(pTextureCalc->GetTexLockOffset(pTexInfo, pReqInfo) != GMM_SUCCESS)
        {
            GMM_ASSERTDPF(0, "ReqLock failed!");
            Status = GMM_ERROR;
        }
    }

    if(RestoreRenderReq == true)
        pReqInfo->ReqRender = 1;

    if(pReqInfo->ReqLock)
    {
        pReqInfo->ReqLock = 0;
        RestoreLockReq    = 1;
    }

    if(pReqInfo->ReqRender)
    {
        if(pTextureCalc->GetTexRenderOffset(pTexInfo, pReqInfo) != GMM_SUCCESS)
        {
            GMM_ASSERTDPF(0, "ReqRender failed!");
            Status = GMM_ERROR;
        }
    }
    
    if(RestoreLockReq)
    {
        pReqInfo->ReqLock = 1;
    }
    
    if(pReqInfo->ReqStdLayout)
    {
        if(pTextureCalc->GetTexStdLayoutOffset(pTexInfo, pReqInfo) != GMM_SUCCESS)
        {
            GMM_ASSERTDPF(0, "ReqStdLayout failed!");
            Status = GMM_ERROR;
        }
    }

    GMM_DPF_EXIT;
    return Status;
}